

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O3

Var Js::JavascriptString::EntryFromCharCode(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  int iVar3;
  bool bVar4;
  uint16 uVar5;
  undefined4 *puVar6;
  Var pvVar7;
  JavascriptString *pJVar8;
  charcount_t length;
  long lVar9;
  int in_stack_00000010;
  CallInfo local_60;
  CallInfo callInfo_local;
  undefined1 local_50 [8];
  ArgumentReader args;
  BufferStringBuilder builder;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  local_60 = callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (in_stack_00000010 != callInfo._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0x3be,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar4) goto LAB_00d12fbd;
    *puVar6 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  local_50 = (undefined1  [8])callInfo;
  ArgumentReader::AdjustArguments((ArgumentReader *)local_50,&local_60);
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (((ulong)local_60 & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0x3c1,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar4) goto LAB_00d12fbd;
    *puVar6 = 0;
  }
  if (((ulong)local_50 & 0xffffff) == 0) {
    JavascriptError::ThrowTypeError(pSVar1,-0x7ff5ec3f,L"String.fromCharCode");
  }
  length = (local_50._0_4_ & 0xffffff) - 1;
  if (length != 1) {
    args.super_Arguments.Values = (Type)BufferStringBuilder::WritableString::New(length,pSVar1);
    BufferStringBuilder::DbgAssertNotFrozen((BufferStringBuilder *)&args.super_Arguments.Values);
    if (((ulong)local_50 & 0xfffffe) != 0) {
      callInfo_local = *(CallInfo *)(args.super_Arguments.Values + 2);
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      lVar9 = 0;
      do {
        iVar3 = (int)lVar9;
        pvVar7 = Arguments::operator[]((Arguments *)local_50,iVar3 + 1);
        if (((ulong)pvVar7 & 0x1ffff00000000) == 0x1000000000000 ||
            ((ulong)pvVar7 & 0xffff000000000000) != 0x1000000000000) {
          if (((ulong)pvVar7 & 0xffff000000000000) == 0x1000000000000) goto LAB_00d12ea6;
          uVar5 = JavascriptConversion::ToUInt16_Full(pvVar7,pSVar1);
          pvVar7 = (Var)(ulong)uVar5;
        }
        else {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar6 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                      ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                      "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
          if (!bVar4) goto LAB_00d12fbd;
          *puVar6 = 0;
LAB_00d12ea6:
          if (((ulong)pvVar7 & 0x1ffff00000000) != 0x1000000000000) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar6 = 1;
            bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                        ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                        "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
            if (!bVar4) goto LAB_00d12fbd;
            *puVar6 = 0;
          }
        }
        *(short *)((long)callInfo_local + lVar9 * 2) = (short)pvVar7;
        lVar9 = lVar9 + 1;
      } while (iVar3 + 2U < (local_50._0_4_ & 0xffffff));
    }
    pJVar8 = BufferStringBuilder::ToString((BufferStringBuilder *)&args.super_Arguments.Values);
    return pJVar8;
  }
  pvVar7 = Arguments::operator[]((Arguments *)local_50,1);
  if (((ulong)pvVar7 & 0x1ffff00000000) == 0x1000000000000 ||
      ((ulong)pvVar7 & 0xffff000000000000) != 0x1000000000000) {
    if (((ulong)pvVar7 & 0xffff000000000000) != 0x1000000000000) {
      uVar5 = JavascriptConversion::ToUInt16_Full(pvVar7,pSVar1);
      pvVar7 = (Var)(ulong)uVar5;
      goto LAB_00d12f99;
    }
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar4) goto LAB_00d12fbd;
    *puVar6 = 0;
  }
  if (((ulong)pvVar7 & 0x1ffff00000000) != 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar4) {
LAB_00d12fbd:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
LAB_00d12f99:
  pJVar8 = CharStringCache::GetStringForChar
                     (&((pSVar1->super_ScriptContextBase).javascriptLibrary)->charStringCache,
                      (char16)pvVar7);
  return pJVar8;
}

Assistant:

Var JavascriptString::EntryFromCharCode(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        Assert(!(callInfo.Flags & CallFlags_New));

        //
        // Construct a new string instance to contain all of the explicit parameters:
        // - Don't include the 'this' parameter.
        //
        if(args.Info.Count == 0)
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedString, _u("String.fromCharCode"));
        }
        AssertMsg(args.Info.Count > 0, "Negative argument count");

        int charLength = args.Info.Count - 1;

        // Special case for single char
        if( charLength == 1 )
        {
            char16 ch = JavascriptConversion::ToUInt16(args[1], scriptContext);
            return scriptContext->GetLibrary()->GetCharStringCache().GetStringForChar(ch);
        }

        BufferStringBuilder builder(charLength,scriptContext);
        char16 * stringBuffer = builder.DangerousGetWritableBuffer();

        //
        // Call ToUInt16 for each parameter, storing the character at the appropriate position.
        //

        for (uint idxArg = 1; idxArg < args.Info.Count; idxArg++)
        {
            *stringBuffer++ = JavascriptConversion::ToUInt16(args[idxArg], scriptContext);
        }

        //
        // Return the new string instance.
        //
        return builder.ToString();
    }